

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O2

uint32_t chck_hash_table_collisions(chck_hash_table *table)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  size_t sVar3;
  long lVar4;
  
  if (table != (chck_hash_table *)0x0) {
    uVar2 = 0;
    while (table = table->next, table != (chck_hash_table *)0x0) {
      sVar3 = 0;
      while (((table->meta).count != sVar3 &&
             (puVar1 = (table->meta).table, puVar1 != (uint8_t *)0x0))) {
        lVar4 = (table->meta).member * sVar3;
        sVar3 = sVar3 + 1;
        uVar2 = uVar2 + puVar1[lVar4];
      }
    }
    return uVar2;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                0x157,"uint32_t chck_hash_table_collisions(struct chck_hash_table *)");
}

Assistant:

uint32_t
chck_hash_table_collisions(struct chck_hash_table *table)
{
   assert(table);

   uint32_t collisions = 0;
   for (struct chck_hash_table *t = table->next; t; t = t->next) {
      struct header *hdr;
      chck_lut_for_each(&t->meta, hdr) {
         if (hdr->placed)
            ++collisions;
      }
   }

   return collisions;
}